

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msat.hpp
# Opt level: O0

void __thiscall CompoundFile::MSAT::loadMSAT(MSAT *this)

{
  int32_t iVar1;
  undefined8 *in_RDI;
  int32_t i;
  SecID id;
  int32_t msatSectorsCount;
  size_t in_stack_ffffffffffffff98;
  fpos<__mbstate_t> *this_00;
  vector<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_> *in_stack_ffffffffffffffa8;
  vector<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_> *in_stack_ffffffffffffffb0;
  SecID *in_stack_ffffffffffffffc0;
  istream *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  int iVar2;
  
  loadFirst109SecIDs(in_stack_ffffffffffffffc8);
  std::vector<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>::operator=
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  std::vector<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>::~vector
            (in_stack_ffffffffffffffb0);
  iVar1 = Header::sectorsInMSAT((Header *)*in_RDI);
  Header::msatFirstSecID((Header *)*in_RDI);
  for (iVar2 = 0; iVar2 < iVar1; iVar2 = iVar2 + 1) {
    this_00 = (fpos<__mbstate_t> *)in_RDI[1];
    Header::sectorSize((Header *)*in_RDI);
    calcFileOffset((SecID *)this_00,in_stack_ffffffffffffff98);
    std::fpos<__mbstate_t>::fpos(this_00,in_stack_ffffffffffffff98);
    std::istream::seekg(this_00,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffc8);
    Header::sectorSize((Header *)*in_RDI);
    loadMSATSector((istream *)CONCAT44(iVar2,in_stack_ffffffffffffffd0),
                   (vector<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_> *)
                   in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
                   (int32_t)((ulong)in_RDI >> 0x20));
  }
  return;
}

Assistant:

inline void
MSAT::loadMSAT()
{
	m_msat = loadFirst109SecIDs( m_stream );

	const int32_t msatSectorsCount = m_header.sectorsInMSAT();

	SecID id = m_header.msatFirstSecID();

	for( int32_t i = 0; i < msatSectorsCount; ++i )
	{
		m_stream.seekg( calcFileOffset( id, m_header.sectorSize() ) );

		loadMSATSector( m_stream, m_msat, id, m_header.sectorSize() );
	}
}